

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  BaseType BVar1;
  char *pcVar2;
  allocator<char> local_31;
  string local_30;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,GenTypeBasic::csharp_typename[BVar1],&local_31);
    ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (BVar1 == BASE_TYPE_STRUCT) {
      pcVar2 = "Offset";
      if (type->struct_def->fixed != false) {
        pcVar2 = "Struct";
      }
    }
    else {
      pcVar2 = "Offset";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + 6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const Type &type) const {
    return IsScalar(type.base_type)
               ? ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel)
               : (IsStruct(type) ? "Struct" : "Offset");
  }